

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O3

void aes128_ni_cbc_decrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (0 < blklen) {
    pauVar2 = (undefined1 (*) [16])((long)blklen + (long)vblk);
    auVar3 = *(undefined1 (*) [16])(ciph + -3);
    do {
      auVar1 = *vblk;
      auVar4 = aesdec(*(undefined1 (*) [16])(ciph + -0x21) ^ auVar1,
                      *(undefined1 (*) [16])(ciph + -0x1f));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x1d));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x1b));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x19));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x17));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x15));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x13));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0x11));
      auVar4 = aesdec(auVar4,*(undefined1 (*) [16])(ciph + -0xf));
      auVar4 = aesdeclast(auVar4,*(undefined1 (*) [16])(ciph + -0xd));
      *(undefined1 (*) [16])vblk = auVar4 ^ auVar3;
      *(undefined1 (*) [16])(ciph + -3) = auVar1;
      vblk = (void *)((long)vblk + 0x10);
      auVar3 = auVar1;
    } while (vblk < pauVar2);
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn decrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i ciphertext = _mm_loadu_si128((const __m128i *)blk);
        __m128i decrypted = decrypt(ciphertext, ctx->keysched_d);
        __m128i plaintext = _mm_xor_si128(decrypted, ctx->iv);
        _mm_storeu_si128((__m128i *)blk, plaintext);
        ctx->iv = ciphertext;
    }
}